

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O1

bool __thiscall
ON_Viewport::GetFrustumLeftPlaneEquation(ON_Viewport *this,ON_PlaneEquation *left_plane_equation)

{
  ON_3dPoint P;
  ON_3dVector N;
  byte bVar1;
  bool bVar2;
  ON_2dVector v;
  ON_2dVector local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  double local_98;
  ON_3dVector local_88;
  ON_3dPoint local_70;
  ON_3dVector local_58;
  ON_3dVector local_40;
  
  bVar1 = this->m_bValidFrustum & this->m_bValidCamera;
  if (bVar1 == 1) {
    if (this->m_projection == perspective_view) {
      ON_2dVector::ON_2dVector(&local_b8,this->m_frus_near,this->m_frus_left);
      bVar2 = ON_2dVector::Unitize(&local_b8);
      if (!bVar2) {
        return bVar2;
      }
      local_98 = (this->m_CamLoc).z;
      local_a8 = (this->m_CamLoc).x;
      uStack_a0 = (this->m_CamLoc).y;
      ::operator*(&local_88,local_b8.x,&this->m_CamX);
      ::operator*(&local_58,local_b8.y,&this->m_CamZ);
      ON_3dVector::operator+(&local_40,&local_88,&local_58);
      local_70.x._0_4_ = (undefined4)local_a8;
      local_70.x._4_4_ = local_a8._4_4_;
      local_70.y._0_4_ = (undefined4)uStack_a0;
      local_70.y._4_4_ = uStack_a0._4_4_;
      local_70.z = local_98;
    }
    else {
      ::operator*(&local_88,this->m_frus_left,&this->m_CamX);
      ON_3dPoint::operator+(&local_70,&this->m_CamLoc,&local_88);
      local_40.z = (this->m_CamX).z;
      local_40.x = (this->m_CamX).x;
      local_40.y = (this->m_CamX).y;
    }
    P.x._4_4_ = local_70.x._4_4_;
    P.x._0_4_ = local_70.x._0_4_;
    P.y._0_4_ = local_70.y._0_4_;
    P.y._4_4_ = local_70.y._4_4_;
    P.z = local_70.z;
    N.y = local_40.y;
    N.x = local_40.x;
    N.z = local_40.z;
    bVar1 = ON_PlaneEquation::Create(left_plane_equation,P,N);
  }
  return (bool)bVar1;
}

Assistant:

bool ON_Viewport::GetFrustumLeftPlaneEquation( 
  ON_PlaneEquation& left_plane_equation
  ) const
{
  bool rc = m_bValidCamera && m_bValidFrustum;
  if (rc)
  {

    if ( IsPerspectiveProjection() )
    {
      ON_2dVector v(m_frus_near,m_frus_left);
      if ( 0 != (rc = v.Unitize()) )
      {
        rc = left_plane_equation.Create(m_CamLoc, v.x*m_CamX + v.y*m_CamZ);
      }
    }
    else
    {
      rc = left_plane_equation.Create(m_CamLoc + m_frus_left*m_CamX, m_CamX);
    }
  }
  return rc;
}